

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O0

void __thiscall Opcode::AABBQuantizedTree::~AABBQuantizedTree(AABBQuantizedTree *this)

{
  AABBQuantizedNode *pAVar1;
  AABBQuantizedNode *pAVar2;
  AABBQuantizedTree *this_local;
  
  (this->super_AABBOptimizedTree)._vptr_AABBOptimizedTree =
       (_func_int **)&PTR__AABBQuantizedTree_00391330;
  if (this->mNodes != (AABBQuantizedNode *)0x0) {
    pAVar1 = this->mNodes;
    if (pAVar1 != (AABBQuantizedNode *)0x0) {
      for (pAVar2 = pAVar1 + pAVar1[-1].mData; pAVar1 != pAVar2; pAVar2 = pAVar2 + -1) {
      }
      operator_delete__(&pAVar1[-1].mData,pAVar1[-1].mData * 0x18 + 8);
    }
    this->mNodes = (AABBQuantizedNode *)0x0;
  }
  AABBOptimizedTree::~AABBOptimizedTree(&this->super_AABBOptimizedTree);
  return;
}

Assistant:

AABBQuantizedTree::~AABBQuantizedTree()
{
	DELETEARRAY(mNodes);
}